

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

type __thiscall
fmt::v5::
visit_format_arg<fmt::v5::arg_formatter<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>,fmt::v5::basic_format_context<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
          (v5 *this,
          arg_formatter<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
          *vis,basic_format_arg<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
               *arg)

{
  char *pcVar1;
  basic_format_arg<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  *extraout_RDX;
  type tVar2;
  iterator iVar3;
  type tVar4;
  basic_string_view<char> value;
  
  switch(arg->type_) {
  case int_type:
    tVar2 = internal::
            arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
            ::operator()((arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
                          *)this,(uint)vis);
    arg = (basic_format_arg<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
           *)tVar2._M_string;
    break;
  case uint_type:
    tVar2 = internal::
            arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
            ::operator()((arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
                          *)this,(uint)vis);
    arg = (basic_format_arg<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
           *)tVar2._M_string;
    break;
  case long_long_type:
    tVar2 = internal::
            arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
            ::operator()((arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
                          *)this,(longlong)vis);
    arg = (basic_format_arg<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
           *)tVar2._M_string;
    break;
  case ulong_long_type:
    tVar2 = internal::
            arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
            ::operator()((arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
                          *)this,(unsigned_long_long)vis);
    arg = (basic_format_arg<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
           *)tVar2._M_string;
    break;
  case bool_type:
    tVar2 = internal::
            arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
            ::operator()((arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
                          *)this,SUB81(vis,0));
    arg = (basic_format_arg<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
           *)tVar2._M_string;
    break;
  case char_type:
    tVar2 = internal::
            arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
            ::operator()((arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
                          *)this,SUB81(vis,0));
    arg = (basic_format_arg<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
           *)tVar2._M_string;
    break;
  case double_type:
    tVar2 = internal::
            arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
            ::operator()((arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
                          *)this,(arg->value_).field_0.double_value);
    arg = (basic_format_arg<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
           *)tVar2._M_string;
    break;
  case last_numeric_type:
    tVar2 = internal::
            arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
            ::operator()((arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
                          *)this,(arg->value_).field_0.long_double_value);
    arg = (basic_format_arg<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
           *)tVar2._M_string;
    break;
  case cstring_type:
    iVar3 = internal::
            arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
            ::operator()((arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
                          *)this,(char_type *)vis);
    arg = (basic_format_arg<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
           *)iVar3._M_string;
    break;
  case string_type:
    value.size_ = (arg->value_).field_0.long_long_value;
    value.data_ = (char *)vis;
    iVar3 = internal::
            arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
            ::operator()((arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
                          *)this,value);
    arg = (basic_format_arg<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
           *)iVar3._M_string;
    break;
  case pointer_type:
    iVar3 = internal::
            arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
            ::operator()((arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
                          *)this,vis);
    arg = (basic_format_arg<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
           *)iVar3._M_string;
    break;
  case custom_type:
    (*(arg->value_).field_0.custom.format)((void *)(arg->value_).field_0.long_long_value,vis->ctx_);
    arg = extraout_RDX;
  default:
    pcVar1 = (vis->
             super_arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
             ).writer_.out_._M_string;
    *(ostream_type **)this =
         (vis->
         super_arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
         ).writer_.out_._M_stream;
    *(char **)(this + 8) = pcVar1;
  }
  tVar4._M_string = (char *)arg;
  tVar4._M_stream = (ostream_type *)this;
  return tVar4;
}

Assistant:

FMT_CONSTEXPR typename internal::result_of<Visitor(int)>::type
    visit_format_arg(Visitor &&vis, const basic_format_arg<Context> &arg) {
  typedef typename Context::char_type char_type;
  switch (arg.type_) {
  case internal::none_type:
    break;
  case internal::named_arg_type:
    FMT_ASSERT(false, "invalid argument type");
    break;
  case internal::int_type:
    return vis(arg.value_.int_value);
  case internal::uint_type:
    return vis(arg.value_.uint_value);
  case internal::long_long_type:
    return vis(arg.value_.long_long_value);
  case internal::ulong_long_type:
    return vis(arg.value_.ulong_long_value);
  case internal::bool_type:
    return vis(arg.value_.int_value != 0);
  case internal::char_type:
    return vis(static_cast<char_type>(arg.value_.int_value));
  case internal::double_type:
    return vis(arg.value_.double_value);
  case internal::long_double_type:
    return vis(arg.value_.long_double_value);
  case internal::cstring_type:
    return vis(arg.value_.string.value);
  case internal::string_type:
    return vis(basic_string_view<char_type>(
                 arg.value_.string.value, arg.value_.string.size));
  case internal::pointer_type:
    return vis(arg.value_.pointer);
  case internal::custom_type:
    return vis(typename basic_format_arg<Context>::handle(arg.value_.custom));
  }
  return vis(monostate());
}